

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9JsonSerialize(jx9_value *pValue,SyBlob *pOut)

{
  sxi32 sVar1;
  json_private_data sJson;
  json_private_data local_18;
  
  local_18.nRecCount = 0;
  local_18.isFirst = 1;
  local_18.iFlags = 0;
  local_18.pOut = pOut;
  sVar1 = VmJsonEncode(pValue,&local_18);
  return sVar1;
}

Assistant:

JX9_PRIVATE int jx9JsonSerialize(jx9_value *pValue,SyBlob *pOut)
{
	json_private_data sJson;
	/* Prepare the JSON data */
	sJson.nRecCount = 0;
	sJson.pOut = pOut;
	sJson.isFirst = 1;
	sJson.iFlags = 0;
	/* Perform the encoding operation */
	VmJsonEncode(pValue, &sJson);
	/* All done */
	return JX9_OK;
}